

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmatrix.c
# Opt level: O0

Real Q_GetVal(QMatrix *Q,size_t RoC,size_t Entry)

{
  LASErrIdType LVar1;
  Real local_28;
  Real Val;
  size_t Entry_local;
  size_t RoC_local;
  QMatrix *Q_local;
  
  LVar1 = LASResult();
  if (LVar1 == LASOK) {
    if (((RoC == 0) || (Q->Dim < RoC)) || (Q->Len[RoC] <= Entry)) {
      LASError(LASRangeErr,"Q_GetVal",Q->Name,(char *)0x0,(char *)0x0);
      local_28 = 0.0;
    }
    else {
      local_28 = Q->El[RoC][Entry].Val;
    }
  }
  else {
    local_28 = 0.0;
  }
  return local_28;
}

Assistant:

Real Q_GetVal(QMatrix *Q, size_t RoC, size_t Entry)
/* returns the value of a matrix element */
{
    Real Val;

    if (LASResult() == LASOK)
        if (RoC > 0 && RoC <= Q->Dim && Entry < Q->Len[RoC]) {
            Val = Q->El[RoC][Entry].Val;
        } else {
            LASError(LASRangeErr, "Q_GetVal", Q->Name, NULL, NULL);
            Val = 0.0;
        }
    else
        Val = 0.0;
    return(Val);
}